

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O1

void HU_GetPlayerWidths(int *maxnamewidth,int *maxscorewidth,int *maxiconheight)

{
  double dVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  FTexture *pFVar5;
  uint uVar6;
  uint uVar7;
  int i;
  long lVar8;
  
  iVar3 = FFont::StringWidth(SmallFont,"Name");
  *maxnamewidth = iVar3;
  lVar8 = 0;
  *maxscorewidth = 0;
  *maxiconheight = 0;
  do {
    if (playeringame[lVar8] == true) {
      puVar2 = (undefined8 *)
               ((ulong)(((&DAT_00a392d8)[lVar8 * 0xa8] - 1 & 0x1cf) * 0x18) +
               (&DAT_00a392c8)[lVar8 * 0x54]);
      do {
        puVar4 = puVar2;
        puVar2 = (undefined8 *)*puVar4;
      } while (*(int *)(puVar4 + 1) != 0x1cf);
      iVar3 = FFont::StringWidth(SmallFont,*(BYTE **)(puVar4[2] + 0x28));
      if (*maxnamewidth < iVar3) {
        *maxnamewidth = iVar3;
      }
      uVar6 = *(uint *)((&players)[lVar8 * 0x54] + 0x508);
      if (0 < (long)(int)uVar6) {
        if (uVar6 < TexMan.Textures.Count) {
          pFVar5 = TexMan.Textures.Array[(int)uVar6].Texture;
        }
        else {
          pFVar5 = (FTexture *)0x0;
        }
        dVar1 = (pFVar5->Scale).X;
        uVar6 = (uint)((double)((uint)pFVar5->Width * 2) / dVar1);
        uVar7 = (uint)((double)(pFVar5->LeftOffset * 2) / dVar1);
        iVar3 = (((uVar6 & 1) + ((int)uVar6 >> 1)) - ((uVar7 & 1) + ((int)uVar7 >> 1))) + 2;
        if (*maxscorewidth < iVar3) {
          *maxscorewidth = iVar3;
        }
        dVar1 = (pFVar5->Scale).Y;
        uVar7 = (uint)((double)((uint)pFVar5->Height * 2) / dVar1);
        uVar6 = (uint)((double)(pFVar5->TopOffset * 2) / dVar1);
        iVar3 = ((uVar7 & 1) + ((int)uVar7 >> 1)) - ((uVar6 & 1) + ((int)uVar6 >> 1));
        if (*maxiconheight < iVar3) {
          *maxiconheight = iVar3;
        }
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  return;
}

Assistant:

void HU_GetPlayerWidths(int &maxnamewidth, int &maxscorewidth, int &maxiconheight)
{
	maxnamewidth = SmallFont->StringWidth("Name");
	maxscorewidth = 0;
	maxiconheight = 0;

	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			int width = SmallFont->StringWidth(players[i].userinfo.GetName());
			if (width > maxnamewidth)
			{
				maxnamewidth = width;
			}
			if (players[i].mo->ScoreIcon.isValid())
			{
				FTexture *pic = TexMan[players[i].mo->ScoreIcon];
				width = pic->GetScaledWidth() - pic->GetScaledLeftOffset() + 2;
				if (width > maxscorewidth)
				{
					maxscorewidth = width;
				}
				// The icon's top offset does not count toward its height, because
				// zdoom.pk3's standard Hexen class icons are designed that way.
				int height = pic->GetScaledHeight() - pic->GetScaledTopOffset();
				if (height > maxiconheight)
				{
					maxiconheight = height;
				}
			}
		}
	}
}